

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void filter_horiz_w8_ssse3(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,int16_t *x_filter)

{
  short sVar1;
  undefined4 uVar2;
  undefined6 uVar3;
  short sVar4;
  undefined4 uVar5;
  undefined6 uVar6;
  undefined8 *in_RDX;
  char extraout_XMM0_Ba;
  undefined1 extraout_XMM0_Bb;
  char extraout_XMM0_Bc;
  undefined1 extraout_XMM0_Bd;
  char extraout_XMM0_Be;
  undefined1 extraout_XMM0_Bf;
  char extraout_XMM0_Bg;
  undefined1 extraout_XMM0_Bh;
  char extraout_XMM0_Bi;
  undefined1 extraout_XMM0_Bj;
  char extraout_XMM0_Bk;
  undefined1 extraout_XMM0_Bl;
  char extraout_XMM0_Bm;
  undefined1 extraout_XMM0_Bn;
  char extraout_XMM0_Bo;
  undefined1 extraout_XMM0_Bp;
  __m128i temp;
  __m128i ss [4];
  __m128i s [8];
  __m128i *in;
  uint8_t *in_stack_fffffffffffffed0;
  int16_t *in_stack_ffffffffffffff08;
  __m128i *in_stack_ffffffffffffff10;
  longlong local_d8 [17];
  undefined8 *local_50;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  
  in = (__m128i *)local_d8;
  local_50 = in_RDX;
  load_8bit_8x8(in_stack_fffffffffffffed0,(ptrdiff_t)in,(__m128i *)0x29f205);
  transpose_16bit_4x8(in,(__m128i *)0x29f218);
  shuffle_filter_convolve8_8_ssse3(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  sVar1 = CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba);
  uVar2 = CONCAT13(extraout_XMM0_Bd,CONCAT12(extraout_XMM0_Bc,sVar1));
  uVar3 = CONCAT15(extraout_XMM0_Bf,CONCAT14(extraout_XMM0_Be,uVar2));
  sVar4 = CONCAT11(extraout_XMM0_Bj,extraout_XMM0_Bi);
  uVar5 = CONCAT13(extraout_XMM0_Bl,CONCAT12(extraout_XMM0_Bk,sVar4));
  uVar6 = CONCAT15(extraout_XMM0_Bn,CONCAT14(extraout_XMM0_Bm,uVar5));
  sStack_26 = (short)((uint)uVar2 >> 0x10);
  sStack_24 = (short)((uint6)uVar3 >> 0x20);
  sStack_22 = (short)(CONCAT17(extraout_XMM0_Bh,CONCAT16(extraout_XMM0_Bg,uVar3)) >> 0x30);
  sStack_1e = (short)((uint)uVar5 >> 0x10);
  sStack_1c = (short)((uint6)uVar6 >> 0x20);
  sStack_1a = (short)(CONCAT17(extraout_XMM0_Bp,CONCAT16(extraout_XMM0_Bo,uVar6)) >> 0x30);
  *local_50 = CONCAT17((0 < sStack_1a) * (sStack_1a < 0x100) * extraout_XMM0_Bo - (0xff < sStack_1a)
                       ,CONCAT16((0 < sStack_1c) * (sStack_1c < 0x100) * extraout_XMM0_Bm -
                                 (0xff < sStack_1c),
                                 CONCAT15((0 < sStack_1e) * (sStack_1e < 0x100) * extraout_XMM0_Bk -
                                          (0xff < sStack_1e),
                                          CONCAT14((0 < sVar4) * (sVar4 < 0x100) * extraout_XMM0_Bi
                                                   - (0xff < sVar4),
                                                   CONCAT13((0 < sStack_22) * (sStack_22 < 0x100) *
                                                            extraout_XMM0_Bg - (0xff < sStack_22),
                                                            CONCAT12((0 < sStack_24) *
                                                                     (sStack_24 < 0x100) *
                                                                     extraout_XMM0_Be -
                                                                     (0xff < sStack_24),
                                                                     CONCAT11((0 < sStack_26) *
                                                                              (sStack_26 < 0x100) *
                                                                              extraout_XMM0_Bc -
                                                                              (0xff < sStack_26),
                                                                              (0 < sVar1) *
                                                                              (sVar1 < 0x100) *
                                                                              extraout_XMM0_Ba -
                                                                              (0xff < sVar1))))))));
  return;
}

Assistant:

static void filter_horiz_w8_ssse3(const uint8_t *const src,
                                  const ptrdiff_t src_stride,
                                  uint8_t *const dst,
                                  const int16_t *const x_filter) {
  __m128i s[8], ss[4], temp;

  load_8bit_8x8(src, src_stride, s);
  // 00 01 10 11 20 21 30 31  40 41 50 51 60 61 70 71
  // 02 03 12 13 22 23 32 33  42 43 52 53 62 63 72 73
  // 04 05 14 15 24 25 34 35  44 45 54 55 64 65 74 75
  // 06 07 16 17 26 27 36 37  46 47 56 57 66 67 76 77
  transpose_16bit_4x8(s, ss);
  temp = shuffle_filter_convolve8_8_ssse3(ss, x_filter);
  // shrink to 8 bit each 16 bits
  temp = _mm_packus_epi16(temp, temp);
  // save only 8 bytes convolve result
  _mm_storel_epi64((__m128i *)dst, temp);
}